

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_ffrecord.c
# Opt level: O0

void recff_string_format(jit_State *J,RecordFFData *rd)

{
  IRRef1 IVar1;
  TRef TVar2;
  TRef TVar3;
  SFormat SVar4;
  TRef TVar5;
  GCstr *pGVar6;
  jit_State *in_RDI;
  IRCallID id;
  TRef trsf;
  TRef tra;
  int nfmt;
  SFormat sf;
  FormatState fs;
  TRef tr;
  TRef hdr;
  int arg;
  GCstr *fmt;
  TRef trfmt;
  undefined4 in_stack_fffffffffffffe98;
  TraceError in_stack_fffffffffffffe9c;
  jit_State *in_stack_fffffffffffffea0;
  undefined4 in_stack_fffffffffffffea8;
  undefined2 in_stack_fffffffffffffeac;
  IRRef1 in_stack_fffffffffffffeae;
  IRRef1 IVar7;
  jit_State *in_stack_fffffffffffffeb0;
  undefined6 in_stack_fffffffffffffeb8;
  IRRef1 in_stack_fffffffffffffebe;
  jit_State *in_stack_fffffffffffffec0;
  jit_State *J_00;
  uint local_11c;
  uint local_10c;
  int iVar8;
  GCstr *str;
  lua_State *L;
  uint local_d4;
  int local_cc;
  
  TVar2 = lj_ir_tostr(in_stack_fffffffffffffea0,in_stack_fffffffffffffe9c);
  pGVar6 = argv2str(in_stack_fffffffffffffea0,
                    (TValue *)CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98));
  local_cc = 1;
  iVar8 = 0;
  TVar3 = lj_ir_kgc(in_stack_fffffffffffffec0,
                    (GCobj *)CONCAT26(in_stack_fffffffffffffebe,in_stack_fffffffffffffeb8),
                    (IRType)((ulong)in_stack_fffffffffffffeb0 >> 0x20));
  (in_RDI->fold).ins.field_0.ot = 0x884;
  (in_RDI->fold).ins.field_0.op1 = (IRRef1)TVar2;
  (in_RDI->fold).ins.field_0.op2 = (IRRef1)TVar3;
  lj_opt_fold((jit_State *)
              CONCAT26(in_stack_fffffffffffffeae,
                       CONCAT24(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8)));
  TVar2 = recff_bufhdr(in_stack_fffffffffffffea0);
  str = pGVar6 + 1;
  L = (lua_State *)((long)&(str->nextgc).gcptr32 + (ulong)pGVar6->len);
  local_d4 = TVar2;
  do {
    SVar4 = lj_strfmt_parse((FormatState *)&stack0xffffffffffffff08);
    IVar7 = (IRRef1)local_d4;
    if (SVar4 == 0) {
      (in_RDI->fold).ins.field_0.ot = 0x5504;
      (in_RDI->fold).ins.field_0.op1 = IVar7;
      (in_RDI->fold).ins.field_0.op2 = (IRRef1)TVar2;
      TVar2 = lj_opt_fold((jit_State *)
                          CONCAT26(in_stack_fffffffffffffeae,
                                   CONCAT24(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8)));
      *in_RDI->base = TVar2;
      return;
    }
    if (SVar4 == 2) {
      local_11c = 0;
    }
    else {
      local_11c = in_RDI->base[local_cc];
      local_cc = local_cc + 1;
    }
    TVar3 = lj_ir_kint(in_stack_fffffffffffffeb0,
                       CONCAT22(in_stack_fffffffffffffeae,in_stack_fffffffffffffeac));
    IVar1 = (IRRef1)local_11c;
    switch(SVar4 & 0xf) {
    case 1:
    case 8:
    default:
      recff_nyi(in_stack_fffffffffffffea0,
                (RecordFFData *)CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98));
      return;
    case 2:
      J_00 = in_RDI;
      lj_str_new(L,(char *)str,CONCAT44(SVar4,iVar8));
      TVar3 = lj_ir_kgc(J_00,(GCobj *)CONCAT26(in_stack_fffffffffffffebe,in_stack_fffffffffffffeb8),
                        (IRType)((ulong)in_stack_fffffffffffffeb0 >> 0x20));
      (in_RDI->fold).ins.field_0.ot = 0x5405;
      (in_RDI->fold).ins.field_0.op1 = IVar7;
      (in_RDI->fold).ins.field_0.op2 = (IRRef1)TVar3;
      local_d4 = lj_opt_fold((jit_State *)
                             CONCAT26(in_stack_fffffffffffffeae,
                                      CONCAT24(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8))
                            );
      break;
    case 3:
      local_10c = 0xb;
      goto LAB_001b1908;
    case 4:
      local_10c = 0xc;
LAB_001b1908:
      if ((local_11c >> 0x18 & 0x1f) - 0xf < 5) {
        if (SVar4 == 3) {
          (in_RDI->fold).ins.field_0.ot = 0x5b04;
          (in_RDI->fold).ins.field_0.op1 = IVar1;
          (in_RDI->fold).ins.field_0.op2 = 0;
          in_stack_fffffffffffffeb0 = in_RDI;
          TVar3 = lj_opt_fold((jit_State *)
                              CONCAT26(in_stack_fffffffffffffeae,
                                       CONCAT24(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8)
                                      ));
          (in_stack_fffffffffffffeb0->fold).ins.field_0.ot = 0x5405;
          (in_stack_fffffffffffffeb0->fold).ins.field_0.op1 = IVar7;
          (in_stack_fffffffffffffeb0->fold).ins.field_0.op2 = (IRRef1)TVar3;
          local_d4 = lj_opt_fold((jit_State *)
                                 CONCAT26(in_stack_fffffffffffffeae,
                                          CONCAT24(in_stack_fffffffffffffeac,
                                                   in_stack_fffffffffffffea8)));
          in_stack_fffffffffffffebe = IVar7;
        }
        else {
          (in_RDI->fold).ins.field_0.ot = 0x5916;
          (in_RDI->fold).ins.field_0.op1 = IVar1;
          (in_RDI->fold).ins.field_0.op2 = 0xad3;
          TVar5 = lj_opt_fold((jit_State *)
                              CONCAT26(in_stack_fffffffffffffeae,
                                       CONCAT24(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8)
                                      ));
          local_d4 = lj_ir_call(in_RDI,IRCALL_lj_strfmt_putfxint,(ulong)local_d4,(ulong)TVar3,
                                (ulong)TVar5);
        }
      }
      else {
LAB_001b1b1a:
        TVar5 = lj_ir_tonum(in_stack_fffffffffffffea0,in_stack_fffffffffffffe9c);
        local_d4 = lj_ir_call(in_RDI,(IRCallID)(ulong)local_10c,(ulong)local_d4,(ulong)TVar3,
                              (ulong)TVar5);
      }
      break;
    case 5:
      local_10c = 0xd;
      goto LAB_001b1b1a;
    case 6:
      if ((local_11c & 0x1f000000) != 0x4000000) {
        recff_nyi(in_stack_fffffffffffffea0,
                  (RecordFFData *)CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98));
        return;
      }
      if (SVar4 == 6) {
        (in_RDI->fold).ins.field_0.ot = 0x5405;
        (in_RDI->fold).ins.field_0.op1 = IVar7;
        (in_RDI->fold).ins.field_0.op2 = IVar1;
        local_d4 = lj_opt_fold((jit_State *)
                               CONCAT26(in_stack_fffffffffffffeae,
                                        CONCAT24(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8
                                                )));
      }
      else if ((SVar4 & 0x10) == 0) {
        local_d4 = lj_ir_call(in_RDI,IRCALL_lj_strfmt_putfstr,(ulong)local_d4,(ulong)TVar3,
                              (ulong)local_11c);
      }
      else {
        local_d4 = lj_ir_call(in_RDI,IRCALL_lj_strfmt_putquoted,(ulong)local_d4,(ulong)local_11c);
      }
      break;
    case 7:
      TVar5 = lj_opt_narrow_toint((jit_State *)
                                  CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98),0);
      if (SVar4 == 7) {
        (in_RDI->fold).ins.field_0.ot = 0x5b04;
        (in_RDI->fold).ins.field_0.op1 = (IRRef1)TVar5;
        (in_RDI->fold).ins.field_0.op2 = 2;
        in_stack_fffffffffffffea0 = in_RDI;
        TVar3 = lj_opt_fold((jit_State *)
                            CONCAT26(IVar7,CONCAT24(in_stack_fffffffffffffeac,
                                                    in_stack_fffffffffffffea8)));
        (in_stack_fffffffffffffea0->fold).ins.field_0.ot = 0x5405;
        (in_stack_fffffffffffffea0->fold).ins.field_0.op1 = IVar7;
        (in_stack_fffffffffffffea0->fold).ins.field_0.op2 = (IRRef1)TVar3;
        local_d4 = lj_opt_fold((jit_State *)
                               CONCAT26(IVar7,CONCAT24(in_stack_fffffffffffffeac,
                                                       in_stack_fffffffffffffea8)));
        in_stack_fffffffffffffeae = IVar7;
      }
      else {
        local_d4 = lj_ir_call(in_RDI,IRCALL_lj_strfmt_putfchar,(ulong)local_d4,(ulong)TVar3,
                              (ulong)TVar5);
      }
    }
    iVar8 = iVar8 + 1;
    if (100 < iVar8) {
      lj_trace_err(in_stack_fffffffffffffea0,in_stack_fffffffffffffe9c);
    }
  } while( true );
}

Assistant:

static void LJ_FASTCALL recff_string_format(jit_State *J, RecordFFData *rd)
{
  TRef trfmt = lj_ir_tostr(J, J->base[0]);
  GCstr *fmt = argv2str(J, &rd->argv[0]);
  int arg = 1;
  TRef hdr, tr;
  FormatState fs;
  SFormat sf;
  int nfmt = 0;
  /* Specialize to the format string. */
  emitir(IRTG(IR_EQ, IRT_STR), trfmt, lj_ir_kstr(J, fmt));
  tr = hdr = recff_bufhdr(J);
  lj_strfmt_init(&fs, strdata(fmt), fmt->len);
  while ((sf = lj_strfmt_parse(&fs)) != STRFMT_EOF) {  /* Parse format. */
    TRef tra = sf == STRFMT_LIT ? 0 : J->base[arg++];
    TRef trsf = lj_ir_kint(J, (int32_t)sf);
    IRCallID id;
    switch (STRFMT_TYPE(sf)) {
    case STRFMT_LIT:
      tr = emitir(IRT(IR_BUFPUT, IRT_PGC), tr,
		  lj_ir_kstr(J, lj_str_new(J->L, fs.str, fs.len)));
      break;
    case STRFMT_INT:
      id = IRCALL_lj_strfmt_putfnum_int;
    handle_int:
      if (!tref_isinteger(tra))
	goto handle_num;
      if (sf == STRFMT_INT) { /* Shortcut for plain %d. */
	tr = emitir(IRT(IR_BUFPUT, IRT_PGC), tr,
		    emitir(IRT(IR_TOSTR, IRT_STR), tra, IRTOSTR_INT));
      } else {
#if LJ_HASFFI
	tra = emitir(IRT(IR_CONV, IRT_U64), tra,
		     (IRT_INT|(IRT_U64<<5)|IRCONV_SEXT));
	tr = lj_ir_call(J, IRCALL_lj_strfmt_putfxint, tr, trsf, tra);
	lj_needsplit(J);
#else
	recff_nyiu(J, rd);  /* Don't bother working around this NYI. */
	return;
#endif
      }
      break;
    case STRFMT_UINT:
      id = IRCALL_lj_strfmt_putfnum_uint;
      goto handle_int;
    case STRFMT_NUM:
      id = IRCALL_lj_strfmt_putfnum;
    handle_num:
      tra = lj_ir_tonum(J, tra);
      tr = lj_ir_call(J, id, tr, trsf, tra);
      if (LJ_SOFTFP32) lj_needsplit(J);
      break;
    case STRFMT_STR:
      if (!tref_isstr(tra)) {
	recff_nyiu(J, rd);  /* NYI: __tostring and non-string types for %s. */
	return;
      }
      if (sf == STRFMT_STR)  /* Shortcut for plain %s. */
	tr = emitir(IRT(IR_BUFPUT, IRT_PGC), tr, tra);
      else if ((sf & STRFMT_T_QUOTED))
	tr = lj_ir_call(J, IRCALL_lj_strfmt_putquoted, tr, tra);
      else
	tr = lj_ir_call(J, IRCALL_lj_strfmt_putfstr, tr, trsf, tra);
      break;
    case STRFMT_CHAR:
      tra = lj_opt_narrow_toint(J, tra);
      if (sf == STRFMT_CHAR)  /* Shortcut for plain %c. */
	tr = emitir(IRT(IR_BUFPUT, IRT_PGC), tr,
		    emitir(IRT(IR_TOSTR, IRT_STR), tra, IRTOSTR_CHAR));
      else
	tr = lj_ir_call(J, IRCALL_lj_strfmt_putfchar, tr, trsf, tra);
      break;
    case STRFMT_PTR:  /* NYI */
    case STRFMT_ERR:
    default:
      recff_nyiu(J, rd);
      return;
    }
    if (++nfmt > 100) lj_trace_err(J, LJ_TRERR_TRACEOV);
  }
  J->base[0] = emitir(IRT(IR_BUFSTR, IRT_STR), tr, hdr);
}